

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

int __thiscall kj::anon_unknown_8::DiskFile::truncate(DiskFile *this,char *__file,__off_t __length)

{
  int iVar1;
  int iVar2;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = ftruncate((this->super_DiskHandle).fd.fd,(__off_t)__file);
    if (-1 < iVar1) {
      iVar2 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
    iVar2 = iVar1;
  } while (iVar1 == -1);
  if (iVar2 == 0) {
    return iVar1;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void truncate(uint64_t size) const override {
    DiskHandle::truncate(size);
  }